

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Function.cc
# Opt level: O0

ssize_t __thiscall Pl_Function::write(Pl_Function *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  function<void_(const_unsigned_char_*,_unsigned_long)> *this_00;
  Pipeline *pPVar2;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  size_t len_local;
  uchar *buf_local;
  Pl_Function *this_local;
  
  this_00 = &std::unique_ptr<Pl_Function::Members,_std::default_delete<Pl_Function::Members>_>::
             operator->(&this->m)->fn;
  std::function<void_(const_unsigned_char_*,_unsigned_long)>::operator()
            (this_00,(uchar *)CONCAT44(in_register_00000034,__fd),(unsigned_long)__buf);
  pPVar2 = Pipeline::next(&this->super_Pipeline);
  if (pPVar2 != (Pipeline *)0x0) {
    pPVar2 = Pipeline::next(&this->super_Pipeline);
    iVar1 = (*pPVar2->_vptr_Pipeline[2])(pPVar2,(uchar *)CONCAT44(in_register_00000034,__fd),__buf);
    pPVar2 = (Pipeline *)CONCAT44(extraout_var,iVar1);
  }
  return (ssize_t)pPVar2;
}

Assistant:

void
Pl_Function::write(unsigned char const* buf, size_t len)
{
    m->fn(buf, len);
    if (next()) {
        next()->write(buf, len);
    }
}